

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathCacheWrapString(xmlXPathContextPtr ctxt,xmlChar *val)

{
  int iVar1;
  void *pvVar2;
  long *plVar3;
  xmlXPathObjectPtr pxVar4;
  
  if ((ctxt != (xmlXPathContextPtr)0x0) && (pvVar2 = ctxt->cache, pvVar2 != (void *)0x0)) {
    plVar3 = *(long **)((long)pvVar2 + 8);
    if (plVar3 != (long *)0x0) {
      iVar1 = (int)plVar3[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar3 + 1) = iVar1 + -1;
        pxVar4 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar1 * 8);
        goto LAB_001e1e58;
      }
    }
    plVar3 = *(long **)((long)pvVar2 + 0x20);
    if (plVar3 != (long *)0x0) {
      iVar1 = (int)plVar3[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar3 + 1) = iVar1 + -1;
        pxVar4 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar1 * 8);
        goto LAB_001e1e58;
      }
    }
  }
  pxVar4 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar4 == (xmlXPathObjectPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating string object\n");
    return (xmlXPathObjectPtr)0x0;
  }
  *(undefined8 *)pxVar4 = 0;
  pxVar4->nodesetval = (xmlNodeSetPtr)0x0;
  pxVar4->stringval = (xmlChar *)0x0;
  pxVar4->user = (void *)0x0;
  *(undefined8 *)&pxVar4->index = 0;
  pxVar4->user2 = (void *)0x0;
  *(undefined8 *)&pxVar4->boolval = 0;
  pxVar4->floatval = 0.0;
  *(undefined8 *)&pxVar4->index2 = 0;
LAB_001e1e58:
  pxVar4->type = XPATH_STRING;
  pxVar4->stringval = val;
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapString(xmlXPathContextPtr ctxt, xmlChar *val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->stringObjs != NULL) &&
	    (cache->stringObjs->number != 0))
	{

	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->stringObjs->items[--cache->stringObjs->number];
	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;
	    /*
	    * Fallback to misc-cache.
	    */
	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	}
    }
    return(xmlXPathWrapString(val));
}